

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserClass.cc
# Opt level: O0

map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
ParserClass::parseAggFunc_abi_cxx11_
          (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,ParserClass *this)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference pbVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  string local_e0 [32];
  _Self local_c0;
  _Self local_b8;
  int local_b0;
  key_type local_ac;
  int index;
  undefined4 local_88;
  key_type local_84;
  _Self local_80;
  key_type local_74;
  _Self local_70 [3];
  string local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> aggFunc;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ParserClass *this_local;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *agg_map;
  
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(__return_storage_ptr__);
  this_00 = &(this->inputs).aggre_funcs;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  local_38._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end1,&local_38);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_58,(string *)pbVar2);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
    if ((*pcVar3 < 'a') ||
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_58), 'z' < *pcVar3)) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
      local_b0 = *pcVar3 + -0x30;
      local_b8._M_node =
           (_Base_ptr)
           std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(__return_storage_ptr__,&local_b0);
      local_c0._M_node =
           (_Base_ptr)
           std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(__return_storage_ptr__);
      bVar1 = std::operator==(&local_b8,&local_c0);
      if (!bVar1) {
        std::operator+((char *)local_e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", ");
        pmVar4 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,&local_b0);
        std::__cxx11::string::operator+=((string *)pmVar4,local_e0);
        std::__cxx11::string::~string(local_e0);
        goto LAB_00105c1c;
      }
      pmVar4 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](__return_storage_ptr__,&local_b0);
      std::__cxx11::string::operator=((string *)pmVar4,local_58);
      local_88 = 3;
    }
    else {
      local_74 = 0;
      local_70[0]._M_node =
           (_Base_ptr)
           std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(__return_storage_ptr__,&local_74);
      local_80._M_node =
           (_Base_ptr)
           std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(__return_storage_ptr__);
      bVar1 = std::operator==(local_70,&local_80);
      if (bVar1) {
        local_84 = 0;
        pmVar4 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,&local_84);
        std::__cxx11::string::operator=((string *)pmVar4,local_58);
        local_88 = 3;
      }
      else {
        std::operator+((char *)&index,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", ");
        local_ac = 0;
        pmVar4 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,&local_ac);
        std::__cxx11::string::operator+=((string *)pmVar4,(string *)&index);
        std::__cxx11::string::~string((string *)&index);
LAB_00105c1c:
        local_88 = 0;
      }
    }
    std::__cxx11::string::~string(local_58);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::map<int, std::string> ParserClass::parseAggFunc()
{
    std::map<int, std::string> agg_map;
    for (auto aggFunc : this->inputs.aggre_funcs)
    {
        if ('a' <= aggFunc[0] && aggFunc[0] <= 'z')
        {
            if (agg_map.find(0) == agg_map.end())
            {
                agg_map[0] = aggFunc;
                continue;
            }
            agg_map[0] += ", " + aggFunc;
        }
        else
        {
            int index = aggFunc[0] - '0';
            if (agg_map.find(index) == agg_map.end())
            {
                agg_map[index] = aggFunc;
                continue;
            }
            agg_map[index] += ", " + aggFunc;
        }
    }
    return agg_map;
}